

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalTimeCoordinator.cpp
# Opt level: O0

bool __thiscall helics::GlobalTimeCoordinator::updateTimeFactors(GlobalTimeCoordinator *this)

{
  bool bVar1;
  iterator this_00;
  reference pDVar2;
  ostream *this_01;
  TimeDependencies *in_RDI;
  pair<bool,_TimeRepresentation<count_time<9,_long>_>_> pVar3;
  DependencyInfo *dep_1;
  iterator __end4_1;
  iterator __begin4_1;
  TimeDependencies *__range4_1;
  DependencyInfo *dep;
  iterator __end4;
  iterator __begin4;
  TimeDependencies *__range4;
  ActionMessage updateTime;
  bool verified;
  pair<bool,_TimeRepresentation<count_time<9,_long>_>_> trig;
  TimeRepresentation<count_time<9,_long>_> trigTime_1;
  TimeRepresentation<count_time<9,_long>_> trigTime;
  TimeData timeStream;
  undefined4 in_stack_fffffffffffffdd8;
  int32_t in_stack_fffffffffffffddc;
  Time in_stack_fffffffffffffde0;
  TimeRepresentation<count_time<9,_long>_> *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  Time in_stack_fffffffffffffe10;
  undefined8 in_stack_fffffffffffffe20;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  in_stack_fffffffffffffe28;
  undefined8 in_stack_fffffffffffffe30;
  __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_1a8;
  pointer *local_1a0;
  undefined4 local_198;
  undefined4 local_194;
  BaseType local_180;
  undefined2 local_178;
  pointer local_170;
  pointer local_168;
  pointer local_160;
  GlobalTimeCoordinator *in_stack_fffffffffffffed8;
  Time in_stack_fffffffffffffee0;
  pointer local_c0;
  bool local_b1;
  TimeRepresentation<count_time<9,_long>_> local_a0;
  pointer local_98;
  baseType local_90;
  TimeRepresentation<count_time<9,_long>_> local_88;
  pointer local_80;
  baseType local_78;
  pointer local_70;
  baseType local_68;
  undefined4 local_60;
  undefined4 local_5c;
  pointer local_58;
  pointer local_50;
  char local_28;
  bool local_1;
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  local_5c = *(undefined4 *)
              &in_RDI[2].dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
  local_60 = 0x8831d580;
  generateMinTimeUpstream
            ((TimeDependencies *)in_stack_fffffffffffffe28._M_current,
             SUB81((ulong)in_stack_fffffffffffffe20 >> 0x38,0),
             (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffe30 >> 0x20),
             (GlobalFederateId)(BaseType)in_stack_fffffffffffffe30,
             (int32_t)in_stack_fffffffffffffe20);
  if (local_28 == '\x05') {
    *(undefined1 *)
     &in_RDI[3].dependencies.
      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
      super__Vector_impl_data._M_start = 5;
    *(pointer *)&in_RDI[2].mDelayedDependency = local_58;
    in_RDI[3].dependencies.
    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = local_58;
    local_1 = false;
  }
  else {
    if (local_28 == '\b') {
      if (*(char *)&in_RDI[3].dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start == '\x05') {
        *(undefined1 *)
         &in_RDI[3].dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = 8;
        *(pointer *)&in_RDI[2].mDelayedDependency = local_58;
        local_68 = (baseType)findNextTriggerEvent((TimeDependencies *)in_stack_fffffffffffffdf8);
        in_RDI[3].dependencies.
        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)local_68;
        *(int *)((long)&in_RDI[2].dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish + 4) =
             *(int *)((long)&in_RDI[2].dependencies.
                             super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 4) + 1;
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)
                           &in_RDI[3].dependencies.
                            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                           (TimeRepresentation<count_time<9,_long>_> *)&cBigTime);
        if (bVar1) {
          local_78 = (baseType)TimeRepresentation<count_time<9,_long>_>::epsilon();
          local_70 = (pointer)TimeRepresentation<count_time<9,_long>_>::operator+
                                        (in_stack_fffffffffffffde8,
                                         (TimeRepresentation<count_time<9,_long>_> *)
                                         in_stack_fffffffffffffde0.internalTimeCode);
        }
        else {
          local_70 = in_RDI[3].dependencies.
                     super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
        }
        *(undefined1 *)
         ((long)&in_RDI[3].dependencies.
                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
        local_80 = local_70;
        sendTimeUpdateRequest(in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
        return true;
      }
      if (*(char *)&in_RDI[3].dependencies.
                    super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start == '\b') {
        bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                          ((TimeRepresentation<count_time<9,_long>_> *)
                           &in_RDI[3].dependencies.
                            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                           (TimeRepresentation<count_time<9,_long>_> *)&cBigTime);
        if (bVar1) {
          in_stack_fffffffffffffdf8 =
               (ActionMessage *)
               &in_RDI[3].dependencies.
                super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
          local_90 = (baseType)TimeRepresentation<count_time<9,_long>_>::epsilon();
          local_88 = TimeRepresentation<count_time<9,_long>_>::operator+
                               (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0.internalTimeCode
                               );
        }
        else {
          local_88.internalTimeCode =
               (baseType)
               in_RDI[3].dependencies.
               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
        }
        local_98 = (pointer)local_88.internalTimeCode;
        bVar1 = TimeDependencies::verifySequenceCounter
                          (in_RDI,in_stack_fffffffffffffe10,
                           (int32_t)((ulong)in_stack_fffffffffffffe00 >> 0x20));
        if (bVar1) {
          pVar3 = checkForTriggered(in_RDI,in_stack_fffffffffffffe10);
          local_a0 = pVar3.second.internalTimeCode;
          local_b1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                               (&local_a0,
                                (TimeRepresentation<count_time<9,_long>_> *)
                                &in_RDI[3].dependencies.
                                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish);
          in_RDI[3].dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)local_a0.internalTimeCode;
          bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                            ((TimeRepresentation<count_time<9,_long>_> *)
                             &in_RDI[3].dependencies.
                              super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                             (TimeRepresentation<count_time<9,_long>_> *)&cBigTime);
          if (bVar1) {
            startingAction =
                 (action_t)
                 ((ulong)&in_RDI[3].dependencies.
                          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish >> 0x20);
            TimeRepresentation<count_time<9,_long>_>::epsilon();
            local_c0 = (pointer)TimeRepresentation<count_time<9,_long>_>::operator+
                                          (in_stack_fffffffffffffde8,
                                           (TimeRepresentation<count_time<9,_long>_> *)
                                           in_stack_fffffffffffffde0.internalTimeCode);
          }
          else {
            local_c0 = in_RDI[3].dependencies.
                       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          }
          local_88.internalTimeCode = (baseType)local_c0;
          if (!local_b1) {
            local_b1 = TimeDependencies::verifySequenceCounter
                                 (in_RDI,in_stack_fffffffffffffe10,
                                  (int32_t)((ulong)in_stack_fffffffffffffe00 >> 0x20));
          }
          if (((((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (local_b1 == false)) ||
             (((ulong)in_RDI[3].dependencies.
                      super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage & 0x100) != 0)) {
            *(int *)((long)&in_RDI[2].dependencies.
                            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish + 4) =
                 *(int *)((long)&in_RDI[2].dependencies.
                                 super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                                 ._M_impl.super__Vector_impl_data._M_finish + 4) + 1;
            *(undefined1 *)
             ((long)&in_RDI[3].dependencies.
                     super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
            sendTimeUpdateRequest(in_stack_fffffffffffffed8,in_stack_fffffffffffffee0);
            return true;
          }
          local_194 = *(undefined4 *)
                       &in_RDI[2].dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          local_198 = *(undefined4 *)
                       &in_RDI[2].dependencies.
                        super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          ActionMessage::ActionMessage
                    (in_stack_fffffffffffffdf8,startingAction,
                     (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                     (GlobalFederateId)(BaseType)in_stack_fffffffffffffe00);
          local_170 = (pointer)local_88.internalTimeCode;
          local_168 = (pointer)local_88.internalTimeCode;
          local_160 = (pointer)local_88.internalTimeCode;
          *(int *)((long)&in_RDI[2].dependencies.
                          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) =
               *(int *)((long)&in_RDI[2].dependencies.
                               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4) + 1;
          local_178 = *(undefined2 *)
                       ((long)&in_RDI[2].dependencies.
                               super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 4);
          local_1a0 = &(in_RDI->dependencies).
                       super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
          local_1a8._M_current =
               (DependencyInfo *)
               TimeDependencies::begin
                         ((TimeDependencies *)
                          CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          this_00 = TimeDependencies::end
                              ((TimeDependencies *)
                               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          while (bVar1 = __gnu_cxx::
                         operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                   ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                     *)this_00._M_current,
                                    (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                   ), ((bVar1 ^ 0xffU) & 1) != 0) {
            pDVar2 = __gnu_cxx::
                     __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                     ::operator*(&local_1a8);
            bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                              ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,&local_88);
            if ((bVar1) &&
               (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                                  ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,
                                   (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1)) {
              local_180 = (pDVar2->fedID).gid;
              ActionMessage::setExtraDestData
                        ((ActionMessage *)this_00._M_current,in_stack_fffffffffffffddc);
              std::function<void_(const_helics::ActionMessage_&)>::operator()
                        ((function<void_(const_helics::ActionMessage_&)> *)this_00._M_current,
                         (ActionMessage *)
                         CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            }
            __gnu_cxx::
            __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
            ::operator++(&local_1a8);
          }
          *(undefined1 *)
           &in_RDI[3].dependencies.
            super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
            _M_impl.super__Vector_impl_data._M_start = 5;
          *(pointer *)&in_RDI[2].mDelayedDependency = local_50;
          in_RDI[3].dependencies.
          super__Vector_base<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = local_50;
          ActionMessage::~ActionMessage((ActionMessage *)this_00._M_current);
        }
        else {
          TimeDependencies::begin
                    ((TimeDependencies *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          TimeDependencies::end
                    ((TimeDependencies *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          while (bVar1 = __gnu_cxx::
                         operator==<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                   ((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                     *)in_stack_fffffffffffffde0.internalTimeCode,
                                    (__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                     *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8)
                                   ), ((bVar1 ^ 0xffU) & 1) != 0) {
            pDVar2 = __gnu_cxx::
                     __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                     ::operator*((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                                  *)&stack0xfffffffffffffe28);
            if ((((pDVar2->updateRequested & 1U) == 0) &&
                (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<=
                                   ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,&local_88),
                bVar1)) &&
               ((bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                                   ((TimeRepresentation<count_time<9,_long>_> *)pDVar2,
                                    (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1 &&
                (bVar1 = checkSequenceCounter
                                   ((DependencyInfo *)
                                    CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                                    in_stack_fffffffffffffde0,0), !bVar1)))) {
              this_01 = std::operator<<((ostream *)&std::cerr,"sequence check but no request");
              std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
            }
            __gnu_cxx::
            __normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
            ::operator++((__normal_iterator<helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                          *)&stack0xfffffffffffffe28);
          }
        }
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool GlobalTimeCoordinator::updateTimeFactors()
{
    auto timeStream = generateMinTimeUpstream(dependencies, true, mSourceId, NoIgnoredFederates, 0);
    if (timeStream.mTimeState == TimeState::time_granted) {
        currentTimeState = TimeState::time_granted;
        currentMinTime = timeStream.next;
        nextEvent = timeStream.next;
        return false;
    }
    if (timeStream.mTimeState == TimeState::time_requested) {
        if (currentTimeState == TimeState::time_granted) {
            currentTimeState = TimeState::time_requested;
            currentMinTime = timeStream.next;
            nextEvent = findNextTriggerEvent(dependencies);
            ++sequenceCounter;
            auto trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
            mNewRequest = false;
            sendTimeUpdateRequest(trigTime);
            return true;
        }
        if (currentTimeState == TimeState::time_requested) {
            auto trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
            if (dependencies.verifySequenceCounter(trigTime, sequenceCounter)) {
                auto trig = checkForTriggered(dependencies, trigTime);
                bool verified{trig.second <= nextEvent};
                nextEvent = trig.second;
                trigTime = (nextEvent < cBigTime) ? nextEvent + Time::epsilon() : nextEvent;
                if (!verified) {
                    verified = dependencies.verifySequenceCounter(trigTime, sequenceCounter);
                }

                if (trig.first || !verified || mNewRequest) {
                    ++sequenceCounter;
                    mNewRequest = false;
                    sendTimeUpdateRequest(trigTime);
                    return true;
                }
                ActionMessage updateTime(CMD_TIME_REQUEST, mSourceId, mSourceId);
                updateTime.actionTime = trigTime;
                updateTime.Te = trigTime;
                updateTime.Tdemin = trigTime;

                ++sequenceCounter;
                updateTime.counter = sequenceCounter;
                for (const auto& dep : dependencies) {
                    if (dep.next <= trigTime && dep.next < cBigTime) {
                        updateTime.dest_id = dep.fedID;
                        updateTime.setExtraDestData(dep.sequenceCounter);
                        sendMessageFunction(updateTime);
                    }
                }
                currentTimeState = TimeState::time_granted;
                currentMinTime = timeStream.Te;
                nextEvent = timeStream.Te;
            } else {
                for (auto& dep : dependencies) {
                    if (dep.updateRequested) {
                        continue;
                    }
                    if (dep.next <= trigTime && dep.next < cBigTime) {
                        if (!checkSequenceCounter(dep, trigTime, sequenceCounter)) {
                            std::cerr << "sequence check but no request" << std::endl;
                            /* ActionMessage updateTime(CMD_REQUEST_CURRENT_TIME,
                                                       mSourceId,
                                                       mSourceId);
                              updateTime.counter = sequenceCounter;

                              updateTime.dest_id = dep.fedID;
                              updateTime.setExtraDestData(dep.sequenceCounter);
                              dep.updateRequested = true;
                              sendMessageFunction(updateTime);
                              */
                        }
                    }
                }
            }
        }
    }
    return true;
}